

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O0

NDevice * __thiscall TrodesConfig::getDevice(TrodesConfig *this,int index)

{
  size_type sVar1;
  int in_EDX;
  NDevice *in_RSI;
  NDevice *in_RDI;
  int iVar2;
  NDevice *this_00;
  
  iVar2 = in_EDX;
  this_00 = in_RSI;
  sVar1 = std::vector<NDevice,_std::allocator<NDevice>_>::size
                    ((vector<NDevice,_std::allocator<NDevice>_> *)&in_RSI->name);
  if (in_EDX < (int)sVar1) {
    std::vector<NDevice,_std::allocator<NDevice>_>::operator[]
              ((vector<NDevice,_std::allocator<NDevice>_> *)&in_RSI->name,(long)iVar2);
    NDevice::NDevice(this_00,(NDevice *)CONCAT44(iVar2,in_EDX));
  }
  else {
    NDevice::NDevice(this_00);
  }
  return in_RDI;
}

Assistant:

NDevice TrodesConfig::getDevice(int index) const{
    if (index >= (int)devices.size()) {
        return NDevice();
    }
    return devices[index];
}